

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O0

int shared_validate(int idx,int mode)

{
  int local_18;
  int r;
  int mode_local;
  int idx_local;
  
  local_18 = shared_mux(idx,mode);
  mode_local = local_18;
  if (local_18 == 0) {
    if ((shared_lt[idx].p == (BLKHEAD *)0x0) && (local_18 = shared_map(idx), local_18 != 0)) {
      shared_demux(idx,mode);
      mode_local = local_18;
    }
    else if (((((shared_lt[idx].p)->s).ID[0] == 'J') && (((shared_lt[idx].p)->s).ID[1] == 'B')) &&
            (((shared_lt[idx].p)->s).tflag == '\x01')) {
      mode_local = 0;
    }
    else {
      shared_demux(idx,mode);
      mode_local = local_18;
    }
  }
  return mode_local;
}

Assistant:

static  int     shared_validate(int idx, int mode)      /* use intrnally inside crit.sect !!! */
 { int r;

   if (SHARED_OK != (r = shared_mux(idx, mode)))  return(r);            /* idx checked by shared_mux */
   if (NULL == shared_lt[idx].p)
     if (SHARED_OK != (r = shared_map(idx)))
       { shared_demux(idx, mode); 
         return(r);
       }
   if ((SHARED_ID_0 != (shared_lt[idx].p)->s.ID[0]) || (SHARED_ID_1 != (shared_lt[idx].p)->s.ID[1]) || (BLOCK_SHARED != (shared_lt[idx].p)->s.tflag))
     { shared_demux(idx, mode);
       return(r);
     }
   return(SHARED_OK);
 }